

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall FxSizeAlign::Resolve(FxSizeAlign *this,FCompileContext *ctx)

{
  PType *pPVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  FxConstant *this_00;
  undefined4 extraout_var_00;
  char *pcVar4;
  FCompileContext *size;
  uint local_54;
  FxExpression *x;
  PType *type;
  FCompileContext *ctx_local;
  FxSizeAlign *this_local;
  
  this_local = this;
  if (((this->super_FxExpression).isresolved & 1U) == 0) {
    (this->super_FxExpression).isresolved = true;
    if (this->Operand != (FxExpression *)0x0) {
      iVar2 = (*this->Operand->_vptr_FxExpression[2])(this->Operand,ctx);
      this->Operand = (FxExpression *)CONCAT44(extraout_var,iVar2);
    }
    if (this->Operand == (FxExpression *)0x0) {
      if (this != (FxSizeAlign *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_local = (FxSizeAlign *)0x0;
    }
    else {
      pPVar1 = this->Operand->ValueType;
      uVar3 = (*this->Operand->_vptr_FxExpression[3])();
      if ((uVar3 & 1) == 0) {
        size = ctx;
        uVar3 = (*this->Operand->_vptr_FxExpression[4])(this->Operand,ctx,0);
        if ((uVar3 & 1) == 0) {
          pcVar4 = "size";
          if (this->Which == 0x180) {
            pcVar4 = "alignment";
          }
          FScriptPosition::Message
                    (&(this->super_FxExpression).ScriptPosition,2,
                     "Operand must be addressable to determine %s",pcVar4);
          if (this != (FxSizeAlign *)0x0) {
            (*(this->super_FxExpression)._vptr_FxExpression[1])();
          }
          this_local = (FxSizeAlign *)0x0;
        }
        else {
          this_00 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)size);
          if (this->Which == 0x180) {
            local_54 = pPVar1->Align;
          }
          else {
            local_54 = *(uint *)&(pPVar1->super_PTypeBase).super_DObject.field_0x24;
          }
          FxConstant::FxConstant(this_00,local_54,&this->Operand->ScriptPosition);
          if (this != (FxSizeAlign *)0x0) {
            (*(this->super_FxExpression)._vptr_FxExpression[1])();
          }
          iVar2 = (*(this_00->super_FxExpression)._vptr_FxExpression[2])(this_00,ctx);
          this_local = (FxSizeAlign *)CONCAT44(extraout_var_00,iVar2);
        }
      }
      else {
        pcVar4 = "size";
        if (this->Which == 0x180) {
          pcVar4 = "alignment";
        }
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,"cannot determine %s of a constant",
                   pcVar4);
        if (this != (FxSizeAlign *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
        this_local = (FxSizeAlign *)0x0;
      }
    }
  }
  return &this_local->super_FxExpression;
}

Assistant:

FxExpression *FxSizeAlign::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Operand, ctx);

	auto type = Operand->ValueType;
	if (Operand->isConstant())
	{
		ScriptPosition.Message(MSG_ERROR, "cannot determine %s of a constant", Which == TK_AlignOf? "alignment" : "size");
		delete this;
		return nullptr;
	}
	else if (!Operand->RequestAddress(ctx, nullptr))
	{
		ScriptPosition.Message(MSG_ERROR, "Operand must be addressable to determine %s", Which == TK_AlignOf ? "alignment" : "size");
		delete this;
		return nullptr;
	}
	else
	{
		FxExpression *x = new FxConstant(Which == TK_AlignOf ? int(type->Align) : int(type->Size), Operand->ScriptPosition);
		delete this;
		return x->Resolve(ctx);
	}
}